

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_enc.c
# Opt level: O1

void VP8WriteProbas(VP8BitWriter *bw,VP8EncProba *probas)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ProbaArray (*paaauVar10) [8];
  ProbaArray (*paaauVar11) [8];
  ProbaArray (*paaauVar12) [8];
  
  paaauVar10 = probas->coeffs_;
  lVar8 = 0;
  lVar5 = 0;
  do {
    lVar4 = 0;
    lVar7 = lVar8;
    paaauVar11 = paaauVar10;
    do {
      lVar3 = 0;
      lVar6 = lVar7;
      paaauVar12 = paaauVar11;
      do {
        lVar9 = 0;
        do {
          bVar1 = (*paaauVar12)[0][0][lVar9];
          iVar2 = VP8PutBit(bw,(uint)(bVar1 != VP8CoeffsProba0[0][0][0][lVar6 + lVar9]),
                            (uint)VP8CoeffsUpdateProba[0][0][0][lVar6 + lVar9]);
          if (iVar2 != 0) {
            VP8PutBits(bw,(uint)bVar1,8);
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 != 0xb);
        lVar3 = lVar3 + 1;
        paaauVar12 = (ProbaArray (*) [8])((*paaauVar12)[0] + 1);
        lVar6 = lVar6 + 0xb;
      } while (lVar3 != 3);
      lVar4 = lVar4 + 1;
      paaauVar11 = (ProbaArray (*) [8])(*paaauVar11 + 1);
      lVar7 = lVar7 + 0x21;
    } while (lVar4 != 8);
    lVar5 = lVar5 + 1;
    paaauVar10 = paaauVar10 + 1;
    lVar8 = lVar8 + 0x108;
  } while (lVar5 != 4);
  iVar2 = VP8PutBitUniform(bw,probas->use_skip_proba_);
  if (iVar2 != 0) {
    VP8PutBits(bw,(uint)probas->skip_proba_,8);
    return;
  }
  return;
}

Assistant:

void VP8WriteProbas(VP8BitWriter* const bw, const VP8EncProba* const probas) {
  int t, b, c, p;
  for (t = 0; t < NUM_TYPES; ++t) {
    for (b = 0; b < NUM_BANDS; ++b) {
      for (c = 0; c < NUM_CTX; ++c) {
        for (p = 0; p < NUM_PROBAS; ++p) {
          const uint8_t p0 = probas->coeffs_[t][b][c][p];
          const int update = (p0 != VP8CoeffsProba0[t][b][c][p]);
          if (VP8PutBit(bw, update, VP8CoeffsUpdateProba[t][b][c][p])) {
            VP8PutBits(bw, p0, 8);
          }
        }
      }
    }
  }
  if (VP8PutBitUniform(bw, probas->use_skip_proba_)) {
    VP8PutBits(bw, probas->skip_proba_, 8);
  }
}